

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall
ON_Internal_ExtrudedEdge::SetFromInitialEdge
          (ON_Internal_ExtrudedEdge *this,ON_SubDEdge *initial_edge)

{
  bool bVar1;
  ulong uVar2;
  ON_SubDEdge *pOVar3;
  ON_SubDEdge *e;
  ulong *puStack_48;
  unsigned_short fei;
  ON_SubDEdgePtr *eptr;
  bool bFoundInitialEdge;
  ON_SubDFace *f;
  ON_SubDFacePtr *pOStack_28;
  unsigned_short efi;
  ON_SubDFacePtr *fptr;
  ON_SubDEdge *initial_edge_local;
  ON_Internal_ExtrudedEdge *this_local;
  
  memcpy(this,&Unset,0x40);
  if (initial_edge == (ON_SubDEdge *)0x0) {
    this_local._7_1_ = false;
  }
  else if (((initial_edge->m_vertex[0] == (ON_SubDVertex *)0x0) ||
           (initial_edge->m_vertex[1] == (ON_SubDVertex *)0x0)) ||
          ((initial_edge->m_vertex[0]->super_ON_SubDComponentBase).m_id ==
           (initial_edge->m_vertex[1]->super_ON_SubDComponentBase).m_id)) {
    this_local._7_1_ = false;
  }
  else {
    pOStack_28 = initial_edge->m_face2;
    for (f._6_2_ = 0; f._6_2_ < initial_edge->m_face_count; f._6_2_ = f._6_2_ + 1) {
      if (f._6_2_ == 2) {
        pOStack_28 = initial_edge->m_facex;
        if (pOStack_28 == (ON_SubDFacePtr *)0x0) {
          return false;
        }
        if ((int)(uint)initial_edge->m_facex_capacity < (int)(initial_edge->m_face_count - 2)) {
          return false;
        }
      }
      uVar2 = pOStack_28->m_ptr & 0xfffffffffffffff8;
      if ((uVar2 == 0) || (*(ushort *)(uVar2 + 0x9c) < 3)) {
        return false;
      }
      bVar1 = false;
      puStack_48 = (ulong *)(uVar2 + 0xa0);
      for (e._6_2_ = 0; e._6_2_ < *(ushort *)(uVar2 + 0x9c); e._6_2_ = e._6_2_ + 1) {
        if (e._6_2_ == 4) {
          puStack_48 = *(ulong **)(uVar2 + 0xc0);
          if (puStack_48 == (ulong *)0x0) {
            return false;
          }
          if ((int)(uint)*(ushort *)(uVar2 + 0x9e) < (int)(*(ushort *)(uVar2 + 0x9c) - 4)) {
            return false;
          }
        }
        pOVar3 = (ON_SubDEdge *)(*puStack_48 & 0xfffffffffffffff8);
        if (pOVar3 == (ON_SubDEdge *)0x0) {
          return false;
        }
        if (((pOVar3->m_vertex[0] == (ON_SubDVertex *)0x0) ||
            (pOVar3->m_vertex[1] == (ON_SubDVertex *)0x0)) ||
           ((pOVar3->m_vertex[0]->super_ON_SubDComponentBase).m_id ==
            (pOVar3->m_vertex[1]->super_ON_SubDComponentBase).m_id)) {
          return false;
        }
        if (pOVar3 == initial_edge) {
          if (bVar1) {
            return false;
          }
          bVar1 = true;
          if ((*puStack_48 & 1) != (pOStack_28->m_ptr & 1)) {
            return false;
          }
        }
        puStack_48 = puStack_48 + 1;
      }
      if (!bVar1) {
        return false;
      }
      pOStack_28 = pOStack_28 + 1;
    }
    this->m_initial_edge_tag = initial_edge->m_edge_tag;
    this->m_initial_vertex_id[0] = (initial_edge->m_vertex[0]->super_ON_SubDComponentBase).m_id;
    this->m_initial_vertex_id[1] = (initial_edge->m_vertex[1]->super_ON_SubDComponentBase).m_id;
    this->m_initial_edge_face_count = (uint)initial_edge->m_face_count;
    this->m_original_edge = initial_edge;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool SetFromInitialEdge(
    ON_SubDEdge* initial_edge
  )
  {
    *this = ON_Internal_ExtrudedEdge::Unset;

    if (nullptr == initial_edge)
      return false;
    if (nullptr == initial_edge->m_vertex[0] || nullptr == initial_edge->m_vertex[1] || initial_edge->m_vertex[0]->m_id == initial_edge->m_vertex[1]->m_id)
      return false;

    // validate edge / face topology information - corrupt information will cause great difficulties during the extrusion process
    const ON_SubDFacePtr* fptr = initial_edge->m_face2;
    for (unsigned short efi = 0; efi < initial_edge->m_face_count; ++efi, ++fptr)
    {
      if (2 == efi)
      {
        fptr = initial_edge->m_facex;
        if (nullptr == fptr)
          return false; // corrupt edge / face topology information
        if (initial_edge->m_facex_capacity < initial_edge->m_face_count - 2)
          return false; // corrupt edge / face topology information
      }
      const ON_SubDFace* f = ON_SUBD_FACE_POINTER(fptr->m_ptr);
      if (nullptr == f || f->m_edge_count < 3)
        return false; // corrupt edge / face topology information

      bool bFoundInitialEdge = false;
      const ON_SubDEdgePtr* eptr = f->m_edge4;
      for (unsigned short fei = 0; fei < f->m_edge_count; ++fei, ++eptr)
      {
        if (4 == fei)
        {
          eptr = f->m_edgex;
          if (nullptr == eptr)
            return false; // corrupt edge / face topology information
          if (f->m_edgex_capacity < f->m_edge_count - 4)
            return false; // corrupt edge / face topology information
        }
        const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(eptr->m_ptr);
        if (nullptr == e)
          return false;
        if (nullptr == e->m_vertex[0] || nullptr == e->m_vertex[1] || e->m_vertex[0]->m_id == e->m_vertex[1]->m_id)
          return false;
        if (e == initial_edge)
        {
          if (bFoundInitialEdge)
            return false;
          bFoundInitialEdge = true;
          if (ON_SUBD_EDGE_DIRECTION(eptr->m_ptr) != ON_SUBD_FACE_DIRECTION(fptr->m_ptr))
            return false;
        }
      }
      if (false == bFoundInitialEdge)
        return false;
    }

    m_initial_edge_tag = initial_edge->m_edge_tag;
    m_initial_vertex_id[0] = initial_edge->m_vertex[0]->m_id;
    m_initial_vertex_id[1] = initial_edge->m_vertex[1]->m_id;
    m_initial_edge_face_count = initial_edge->m_face_count;
    m_original_edge = initial_edge;

    return true;
  }